

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcRootLogLikelihoodsByPartition
          (BeagleCPU4StateImpl<float,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  float **ppfVar12;
  float **ppfVar13;
  int *piVar14;
  float *pfVar15;
  float *pfVar16;
  double *pdVar17;
  int iVar18;
  int k_1;
  ulong uVar19;
  int iVar20;
  long lVar21;
  float *pfVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 in_XMM3_Qb;
  float *local_98;
  
  if (0 < partitionCount) {
    ppfVar12 = (this->super_BeagleCPUImpl<float,_1,_0>).gPartials;
    ppfVar13 = (this->super_BeagleCPUImpl<float,_1,_0>).gCategoryWeights;
    iVar7 = (this->super_BeagleCPUImpl<float,_1,_0>).kExtraPatterns;
    piVar14 = (this->super_BeagleCPUImpl<float,_1,_0>).gPatternPartitionsStartPatterns;
    iVar8 = (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount;
    uVar24 = 0;
    pfVar22 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
    uVar9 = (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
    local_98 = pfVar22;
    do {
      iVar10 = piVar14[partitionIndices[uVar24]];
      iVar11 = piVar14[(long)partitionIndices[uVar24] + 1];
      pfVar15 = ppfVar12[bufferIndices[uVar24]];
      iVar1 = iVar10 * 4;
      pfVar16 = ppfVar13[categoryWeightsIndices[uVar24]];
      iVar20 = iVar1;
      if (iVar11 - iVar10 != 0 && iVar10 <= iVar11) {
        fVar2 = *pfVar16;
        lVar21 = 0;
        iVar20 = iVar11 - iVar10;
        do {
          pfVar22[iVar1 + lVar21] = fVar2 * pfVar15[iVar1 + lVar21];
          pfVar22[(long)iVar1 + lVar21 + 1] = fVar2 * pfVar15[(long)iVar1 + lVar21 + 1];
          pfVar22[(long)iVar1 + lVar21 + 2] = fVar2 * pfVar15[(long)iVar1 + lVar21 + 2];
          pfVar22[(long)iVar1 + lVar21 + 3] = fVar2 * pfVar15[(long)iVar1 + lVar21 + 3];
          lVar21 = lVar21 + 4;
          iVar20 = iVar20 + -1;
        } while (iVar20 != 0);
        iVar20 = iVar1 + (int)lVar21;
      }
      if (1 < (int)uVar9) {
        uVar19 = 1;
        local_98 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
        do {
          iVar20 = iVar20 + ((iVar10 - iVar11) + iVar8) * 4;
          if (iVar10 < iVar11) {
            fVar2 = pfVar16[uVar19];
            lVar21 = 0;
            iVar18 = iVar11 - iVar10;
            do {
              auVar27 = vfmadd213ss_fma(ZEXT416((uint)pfVar15[iVar20 + lVar21]),ZEXT416((uint)fVar2)
                                        ,ZEXT416((uint)local_98[iVar1 + lVar21]));
              local_98[iVar1 + lVar21] = auVar27._0_4_;
              auVar27 = vfmadd213ss_fma(ZEXT416((uint)pfVar15[(long)iVar20 + lVar21 + 1]),
                                        ZEXT416((uint)fVar2),
                                        ZEXT416((uint)local_98[(long)iVar1 + lVar21 + 1]));
              local_98[(long)iVar1 + lVar21 + 1] = auVar27._0_4_;
              auVar27 = vfmadd213ss_fma(ZEXT416((uint)pfVar15[(long)iVar20 + lVar21 + 2]),
                                        ZEXT416((uint)fVar2),
                                        ZEXT416((uint)local_98[(long)iVar1 + lVar21 + 2]));
              local_98[(long)iVar1 + lVar21 + 2] = auVar27._0_4_;
              auVar27 = vfmadd213ss_fma(ZEXT416((uint)pfVar15[(long)iVar20 + lVar21 + 3]),
                                        ZEXT416((uint)fVar2),
                                        ZEXT416((uint)local_98[(long)iVar1 + lVar21 + 3]));
              local_98[(long)iVar1 + lVar21 + 3] = auVar27._0_4_;
              lVar21 = lVar21 + 4;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
            iVar20 = iVar20 + (int)lVar21;
          }
          iVar20 = iVar20 + iVar7 * 4;
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar9);
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != (uint)partitionCount);
    if (0 < partitionCount) {
      uVar24 = 0;
      do {
        piVar14 = (this->super_BeagleCPUImpl<float,_1,_0>).gPatternPartitionsStartPatterns;
        iVar7 = piVar14[partitionIndices[uVar24]];
        lVar21 = (long)iVar7;
        iVar8 = piVar14[(long)partitionIndices[uVar24] + 1];
        lVar25 = (long)iVar8;
        if (iVar7 < iVar8) {
          iVar8 = cumulativeScaleIndices[uVar24];
          pfVar22 = (this->super_BeagleCPUImpl<float,_1,_0>).gStateFrequencies
                    [stateFrequenciesIndices[uVar24]];
          fVar2 = pfVar22[1];
          fVar3 = *pfVar22;
          fVar4 = pfVar22[2];
          fVar5 = pfVar22[3];
          pfVar22 = local_98 + (long)(iVar7 * 4) + 3;
          lVar23 = lVar21;
          do {
            auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * pfVar22[-2])),ZEXT416((uint)fVar3),
                                      ZEXT416((uint)pfVar22[-3]));
            auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar4),ZEXT416((uint)pfVar22[-1]));
            auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar5),ZEXT416((uint)*pfVar22));
            dVar26 = log((double)auVar27._0_4_);
            pfVar22 = pfVar22 + 4;
            pfVar15 = (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp;
            pfVar15[lVar23] = (float)dVar26;
            lVar23 = lVar23 + 1;
          } while (lVar25 != lVar23);
          if (iVar8 != -1) {
            pfVar22 = (this->super_BeagleCPUImpl<float,_1,_0>).gScaleBuffers[iVar8];
            lVar23 = lVar21;
            do {
              pfVar15[lVar23] = pfVar22[lVar23] + pfVar15[lVar23];
              lVar23 = lVar23 + 1;
            } while (lVar25 != lVar23);
          }
          auVar27 = ZEXT816(0) << 0x40;
          outSumLogLikelihoodByPartition[uVar24] = 0.0;
          pdVar17 = (this->super_BeagleCPUImpl<float,_1,_0>).gPatternWeights;
          do {
            auVar28._0_8_ = (double)pfVar15[lVar21];
            auVar28._8_8_ = in_XMM3_Qb;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = pdVar17[lVar21];
            auVar27 = vfmadd231sd_fma(auVar27,auVar28,auVar6);
            lVar21 = lVar21 + 1;
            outSumLogLikelihoodByPartition[uVar24] = auVar27._0_8_;
          } while (lVar25 != lVar21);
        }
        else {
          outSumLogLikelihoodByPartition[uVar24] = 0.0;
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 != (uint)partitionCount);
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition(
                                                                    const int* bufferIndices,
                                                                    const int* categoryWeightsIndices,
                                                                    const int* stateFrequenciesIndices,
                                                                    const int* cumulativeScaleIndices,
                                                                    const int* partitionIndices,
                                                                    int partitionCount,
                                                                    double* outSumLogLikelihoodByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        const REALTYPE* rootPartials = gPartials[bufferIndices[p]];
        assert(rootPartials);
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[p]];

        int v = startPattern * 4;
        const REALTYPE wt0 = wt[0];
        for (int k = startPattern; k < endPattern; k++) {
            integrationTmp[v    ] = rootPartials[v    ] * wt0;
            integrationTmp[v + 1] = rootPartials[v + 1] * wt0;
            integrationTmp[v + 2] = rootPartials[v + 2] * wt0;
            integrationTmp[v + 3] = rootPartials[v + 3] * wt0;
            v += 4;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            int u = startPattern * 4;
            v += ((kPatternCount - endPattern) + startPattern) * 4;
            const REALTYPE wtl = wt[l];
            for (int k = startPattern; k < endPattern; k++) {
                integrationTmp[u    ] += rootPartials[v    ] * wtl;
                integrationTmp[u + 1] += rootPartials[v + 1] * wtl;
                integrationTmp[u + 2] += rootPartials[v + 2] * wtl;
                integrationTmp[u + 3] += rootPartials[v + 3] * wtl;

                u += 4;
                v += 4;
            }
        v += 4 * kExtraPatterns;
        }
    }
    integrateOutStatesAndScaleByPartition(integrationTmp, stateFrequenciesIndices, cumulativeScaleIndices, partitionIndices, partitionCount, outSumLogLikelihoodByPartition);
}